

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

bool __thiscall cmFindLibraryHelper::CheckDirectory(cmFindLibraryHelper *this,string *path)

{
  iterator path_00;
  bool bVar1;
  reference name;
  __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
  local_30;
  __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
  local_28;
  iterator i;
  string *path_local;
  cmFindLibraryHelper *this_local;
  
  i._M_current = (Name *)path;
  local_28._M_current =
       (Name *)std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
               begin(&this->Names);
  while( true ) {
    local_30._M_current =
         (Name *)std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                 ::end(&this->Names);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    path_00 = i;
    if (!bVar1) {
      return false;
    }
    name = __gnu_cxx::
           __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
           ::operator*(&local_28);
    bVar1 = CheckDirectoryForName(this,(string *)path_00._M_current,name);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmFindLibraryHelper::Name_*,_std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool cmFindLibraryHelper::CheckDirectory(std::string const& path)
{
  for(std::vector<Name>::iterator i = this->Names.begin();
      i != this->Names.end(); ++i)
    {
    if(this->CheckDirectoryForName(path, *i))
      {
      return true;
      }
    }
  return false;
}